

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O3

void __thiscall leveldb::FilterBlockBuilder::AddKey(FilterBlockBuilder *this,Slice *key)

{
  char *pcVar1;
  iterator __position;
  unsigned_long local_20;
  
  pcVar1 = key->data_;
  local_20 = (this->keys_)._M_string_length;
  __position._M_current =
       (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->start_,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::__cxx11::string::append((char *)&this->keys_,(ulong)pcVar1);
  return;
}

Assistant:

void FilterBlockBuilder::AddKey(const Slice& key) {
  Slice k = key;
  start_.push_back(keys_.size());
  keys_.append(k.data(), k.size());
}